

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Function_Type.cxx
# Opt level: O0

void __thiscall Fl_Class_Type::write_code1(Fl_Class_Type *this)

{
  char *pcVar1;
  size_t sVar2;
  char *pcVar3;
  Fl_Class_Type *this_local;
  
  this->parent_class = current_class;
  current_class = this;
  this->write_public_state = '\0';
  write_h("\n");
  Fl_Type::write_comment_h(&this->super_Fl_Type,"");
  pcVar1 = prefix(this);
  if (pcVar1 != (char *)0x0) {
    pcVar1 = prefix(this);
    sVar2 = strlen(pcVar1);
    if (sVar2 != 0) {
      pcVar1 = prefix(this);
      pcVar3 = Fl_Type::name(&this->super_Fl_Type);
      write_h("class %s %s ",pcVar1,pcVar3);
      goto LAB_0018bc4b;
    }
  }
  pcVar1 = Fl_Type::name(&this->super_Fl_Type);
  write_h("class %s ",pcVar1);
LAB_0018bc4b:
  if (this->subclass_of != (char *)0x0) {
    write_h(": %s ",this->subclass_of);
  }
  write_h("{\n");
  return;
}

Assistant:

void Fl_Class_Type::write_code1() {
  parent_class = current_class;
  current_class = this;
  write_public_state = 0;
  write_h("\n");
  write_comment_h();
  if (prefix() && strlen(prefix()))
    write_h("class %s %s ", prefix(), name());
  else
    write_h("class %s ", name());
  if (subclass_of) write_h(": %s ", subclass_of);
  write_h("{\n");
}